

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

QList<int> * __thiscall QHash<int,_QList<int>_>::value(QHash<int,_QList<int>_> *this,int *key)

{
  QList<int> *pQVar1;
  QList<int> *in_RDI;
  QList<int> *v;
  QList<int> *in_stack_ffffffffffffffc8;
  QList<int> *pQVar2;
  
  pQVar2 = in_RDI;
  pQVar1 = valueImpl<int>((QHash<int,_QList<int>_> *)in_RDI,(int *)in_RDI);
  if (pQVar1 == (QList<int> *)0x0) {
    memset(in_RDI,0,0x18);
    QList<int>::QList((QList<int> *)0x9f758c);
  }
  else {
    QList<int>::QList(in_RDI,in_stack_ffffffffffffffc8);
  }
  return pQVar2;
}

Assistant:

T value(const Key &key) const noexcept
    {
        if (T *v = valueImpl(key))
            return *v;
        else
            return T();
    }